

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture_unittests.h
# Opt level: O2

string * __thiscall Capital::operator()(string *__return_storage_ptr__,Capital *this,string *s)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_58,'\x01');
  std::__cxx11::string::substr((ulong)&local_38,(ulong)s);
  std::operator+(__return_storage_ptr__,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

const string operator()(const string& s) const {
    return string(1, s[0] ^ 32) + s.substr(1);
  }